

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdAddMultisigScriptData(void *handle,void *multisig_handle,char *pubkey)

{
  CfdException *pCVar1;
  allocator local_61;
  string pubkey_str;
  Pubkey key;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&pubkey_str,"MultisigScript",(allocator *)&key);
  cfd::capi::CheckBuffer(multisig_handle,&pubkey_str);
  std::__cxx11::string::~string((string *)&pubkey_str);
  if (pubkey == (char *)0x0) {
    pubkey_str._M_dataplus._M_p = "cfdcapi_address.cpp";
    pubkey_str._M_string_length._0_4_ = 0x107;
    pubkey_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_70bd90;
    cfd::core::logger::warn<>((CfdSourceLocation *)&pubkey_str,"pubkey is null.");
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pubkey_str,"Failed to parameter. pubkey is null.",(allocator *)&key);
    cfd::core::CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&pubkey_str);
    __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(uint *)((long)multisig_handle + 0xa54) < 0x14) {
    std::__cxx11::string::string((string *)&pubkey_str,pubkey,&local_61);
    cfd::core::Pubkey::Pubkey(&key,&pubkey_str);
    std::__cxx11::string::~string((string *)&pubkey_str);
    cfd::core::Pubkey::GetHex_abi_cxx11_(&pubkey_str,&key);
    std::__cxx11::string::copy
              ((char *)&pubkey_str,
               (long)multisig_handle + (ulong)*(uint *)((long)multisig_handle + 0xa54) * 0x83 + 0x18
               ,0x82);
    *(int *)((long)multisig_handle + 0xa54) = *(int *)((long)multisig_handle + 0xa54) + 1;
    std::__cxx11::string::~string((string *)&pubkey_str);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    return 0;
  }
  pubkey_str._M_dataplus._M_p = "cfdcapi_address.cpp";
  pubkey_str._M_string_length._0_4_ = 0x111;
  pubkey_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_70bd90;
  cfd::core::logger::warn<>
            ((CfdSourceLocation *)&pubkey_str,"The number of pubkey has reached the upper limit.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&pubkey_str,"The number of pubkey has reached the upper limit.",
             (allocator *)&key);
  cfd::core::CfdException::CfdException(pCVar1,kCfdOutOfRangeError,&pubkey_str);
  __cxa_throw(pCVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddMultisigScriptData(
    void* handle, void* multisig_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    Pubkey key = Pubkey(std::string(pubkey));
    std::string pubkey_str = key.GetHex();
    pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}